

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-devurandom.c
# Opt level: O0

int uv__random_readpath(char *path,void *buf,size_t buflen)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  bool bVar4;
  int fd;
  ssize_t n;
  size_t pos;
  stat s;
  size_t buflen_local;
  void *buf_local;
  char *path_local;
  
  s.__glibc_reserved[2] = buflen;
  path_local._4_4_ = uv__open_cloexec(path,0);
  if (-1 < path_local._4_4_) {
    iVar1 = fstat64(path_local._4_4_,(stat64 *)&pos);
    if (iVar1 == 0) {
      if (((uint)s.st_nlink & 0xf000) == 0x2000) {
        for (n = 0; n != s.__glibc_reserved[2]; n = sVar3 + n) {
          do {
            sVar3 = read(path_local._4_4_,(void *)((long)buf + n),s.__glibc_reserved[2] - n);
            bVar4 = false;
            if (sVar3 == -1) {
              piVar2 = __errno_location();
              bVar4 = *piVar2 == 4;
            }
          } while (bVar4);
          if (sVar3 == -1) {
            uv__close(path_local._4_4_);
            piVar2 = __errno_location();
            return -*piVar2;
          }
          if (sVar3 == 0) {
            uv__close(path_local._4_4_);
            return -5;
          }
        }
        uv__close(path_local._4_4_);
        path_local._4_4_ = 0;
      }
      else {
        uv__close(path_local._4_4_);
        path_local._4_4_ = -5;
      }
    }
    else {
      uv__close(path_local._4_4_);
      piVar2 = __errno_location();
      path_local._4_4_ = -*piVar2;
    }
  }
  return path_local._4_4_;
}

Assistant:

int uv__random_readpath(const char* path, void* buf, size_t buflen) {
  struct stat s;
  size_t pos;
  ssize_t n;
  int fd;

  fd = uv__open_cloexec(path, O_RDONLY);

  if (fd < 0)
    return fd;

  if (fstat(fd, &s)) {
    uv__close(fd);
    return UV__ERR(errno);
  }

  if (!S_ISCHR(s.st_mode)) {
    uv__close(fd);
    return UV_EIO;
  }

  for (pos = 0; pos != buflen; pos += n) {
    do
      n = read(fd, (char*) buf + pos, buflen - pos);
    while (n == -1 && errno == EINTR);

    if (n == -1) {
      uv__close(fd);
      return UV__ERR(errno);
    }

    if (n == 0) {
      uv__close(fd);
      return UV_EIO;
    }
  }

  uv__close(fd);
  return 0;
}